

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetSumAggregateNoOverflow(AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  BinderException *this;
  int iVar1;
  undefined7 in_register_00000031;
  FunctionNullHandling in_R8B;
  allocator local_69;
  undefined1 local_68 [56];
  LogicalType local_30;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 9) {
    LogicalType::LogicalType((LogicalType *)local_68,BIGINT);
    LogicalType::LogicalType((LogicalType *)(local_68 + 0x20),HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,long,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_68,(LogicalType *)(local_68 + 0x20)
               ,(LogicalType *)0x0,in_R8B);
    LogicalType::~LogicalType((LogicalType *)(local_68 + 0x20));
    LogicalType::~LogicalType((LogicalType *)local_68);
    ::std::__cxx11::string::assign
              ((char *)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                        super_Function.name);
  }
  else {
    if (iVar1 != 7) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_68,"Unsupported internal type for sum_no_overflow",&local_69);
      BinderException::BinderException(this,(string *)local_68);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType((LogicalType *)local_68,INTEGER);
    LogicalType::LogicalType(&local_30,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,int,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_68,&local_30,(LogicalType *)0x0,
               in_R8B);
    LogicalType::~LogicalType(&local_30);
    LogicalType::~LogicalType((LogicalType *)local_68);
    ::std::__cxx11::string::assign
              ((char *)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                        super_Function.name);
  }
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  __return_storage_ptr__->bind = SumNoOverflowBind;
  __return_storage_ptr__->serialize = SumNoOverflowSerialize;
  __return_storage_ptr__->deserialize = SumNoOverflowDeserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetSumAggregateNoOverflow(PhysicalType type) {
	switch (type) {
	case PhysicalType::INT32: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int32_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::INTEGER, LogicalType::HUGEINT);
		function.name = "sum_no_overflow";
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		function.bind = SumNoOverflowBind;
		function.serialize = SumNoOverflowSerialize;
		function.deserialize = SumNoOverflowDeserialize;
		return function;
	}
	case PhysicalType::INT64: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int64_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::BIGINT, LogicalType::HUGEINT);
		function.name = "sum_no_overflow";
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		function.bind = SumNoOverflowBind;
		function.serialize = SumNoOverflowSerialize;
		function.deserialize = SumNoOverflowDeserialize;
		return function;
	}
	default:
		throw BinderException("Unsupported internal type for sum_no_overflow");
	}
}